

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O2

void __thiscall
slang::ast::ConditionalStatement::serializeTo(ConditionalStatement *this,ASTSerializer *serializer)

{
  long lVar1;
  Condition *cond;
  pointer pCVar2;
  string_view sVar3;
  
  sVar3._M_str = "conditions";
  sVar3._M_len = 10;
  ASTSerializer::startArray(serializer,sVar3);
  pCVar2 = (this->conditions)._M_ptr;
  for (lVar1 = (this->conditions)._M_extent._M_extent_value << 4; lVar1 != 0; lVar1 = lVar1 + -0x10)
  {
    ASTSerializer::startObject(serializer);
    ASTSerializer::write(serializer,4,"expr",(size_t)(pCVar2->expr).ptr);
    if (pCVar2->pattern != (Pattern *)0x0) {
      ASTSerializer::write(serializer,7,"pattern",(size_t)pCVar2->pattern);
    }
    ASTSerializer::endObject(serializer);
    pCVar2 = pCVar2 + 1;
  }
  ASTSerializer::endArray(serializer);
  sVar3 = ast::toString(this->check);
  ASTSerializer::write(serializer,5,"check",sVar3._M_len);
  ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
    return;
  }
  return;
}

Assistant:

void ConditionalStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();
    serializer.write("check", toString(check));

    serializer.write("ifTrue", ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}